

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O2

bool __thiscall jbcoin::STArray::isEquivalent(STArray *this,STBase *t)

{
  bool bVar1;
  
  if (t->_vptr_STBase != (_func_int **)&PTR__STArray_002f7fa8) {
    return false;
  }
  bVar1 = std::operator==(&this->v_,
                          (vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_> *)(t + 1));
  return bVar1;
}

Assistant:

bool STArray::isEquivalent (const STBase& t) const
{
    auto v = dynamic_cast<const STArray*> (&t);
    return v != nullptr && v_ == v->v_;
}